

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

CommandSignature __thiscall
anon_unknown.dwarf_1c0a25::SwiftCompilerShellCommand::getSignature(SwiftCompilerShellCommand *this)

{
  CommandSignature CVar1;
  hash_code hVar2;
  CommandSignature *pCVar3;
  CommandSignature local_a8;
  hash_combine_recursive_helper local_a0;
  
  CVar1 = llbuild::buildsystem::ExternalCommand::getSignature(&this->super_ExternalCommand);
  llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_a0);
  local_a0.buffer._0_8_ = CVar1;
  hVar2 = llvm::hashing::detail::hash_combine_recursive_helper::combine<std::__cxx11::string>
                    (&local_a0,0,local_a0.buffer + 8,(char *)&local_a0.state,&this->executable);
  llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_a0);
  local_a0.buffer._0_8_ = hVar2;
  local_a8.value =
       (uint64_t)
       llvm::hashing::detail::hash_combine_recursive_helper::combine<std::__cxx11::string>
                 (&local_a0,0,local_a0.buffer + 8,(char *)&local_a0.state,&this->moduleName);
  pCVar3 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (&local_a8,&this->moduleAliases);
  llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_a0);
  local_a0.buffer._0_8_ = pCVar3->value;
  hVar2 = llvm::hashing::detail::hash_combine_recursive_helper::combine<std::__cxx11::string>
                    (&local_a0,0,local_a0.buffer + 8,(char *)&local_a0.state,&this->moduleOutputPath
                    );
  pCVar3->value = hVar2.value;
  pCVar3 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (pCVar3,&this->sourcesList);
  pCVar3 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (pCVar3,&this->objectsList);
  pCVar3 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>
                     (pCVar3,&this->importPaths);
  llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_a0);
  local_a0.buffer._0_8_ = pCVar3->value;
  hVar2 = llvm::hashing::detail::hash_combine_recursive_helper::combine<std::__cxx11::string>
                    (&local_a0,0,local_a0.buffer + 8,(char *)&local_a0.state,&this->tempsPath);
  pCVar3->value = hVar2.value;
  pCVar3 = llbuild::basic::CommandSignature::combine<std::__cxx11::string>(pCVar3,&this->otherArgs);
  pCVar3 = llbuild::basic::CommandSignature::combine(pCVar3,this->isLibrary);
  return (CommandSignature)pCVar3->value;
}

Assistant:

virtual CommandSignature getSignature() const override {
    return ExternalCommand::getSignature()
        .combine(executable)
        .combine(moduleName)
        .combine(moduleAliases)
        .combine(moduleOutputPath)
        .combine(sourcesList)
        .combine(objectsList)
        .combine(importPaths)
        .combine(tempsPath)
        .combine(otherArgs)
        .combine(isLibrary);
  }